

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<4,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  Geometry *pGVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  AABBNodeMB4D *node1;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  ulong *puVar21;
  ulong uVar22;
  Scene *pSVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  float fVar35;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar36;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  float fVar48;
  float fVar58;
  float fVar60;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar63;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar59;
  float fVar61;
  float fVar62;
  float fVar64;
  undefined1 auVar57 [16];
  float fVar65;
  float fVar81;
  float fVar82;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar83;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar84;
  float fVar85;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar96;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [64];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [64];
  float fVar115;
  float fVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar125;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar123;
  float fVar124;
  undefined1 auVar122 [64];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [64];
  undefined1 auVar130 [16];
  undefined1 auVar131 [64];
  float fVar132;
  undefined1 auVar133 [16];
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar134 [64];
  float fVar138;
  undefined1 auVar139 [16];
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar140 [64];
  float fVar144;
  undefined1 auVar145 [16];
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar146 [64];
  float fVar150;
  undefined1 auVar151 [16];
  float fVar156;
  undefined1 auVar152 [16];
  float fVar154;
  float fVar155;
  undefined1 auVar153 [64];
  float fVar157;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar158 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_aa9;
  undefined8 local_aa8;
  float fStack_aa0;
  float fStack_a9c;
  int local_a8c;
  undefined8 local_a88;
  float fStack_a80;
  float fStack_a7c;
  undefined8 local_a78;
  float fStack_a70;
  float fStack_a6c;
  RayQueryContext *local_a60;
  undefined1 local_a58 [16];
  undefined1 local_a48 [16];
  undefined1 local_a38 [16];
  undefined1 local_a28 [16];
  undefined1 local_a18 [16];
  undefined1 local_a08 [16];
  undefined1 local_9f8 [16];
  undefined1 local_9e8 [16];
  long local_9d0;
  undefined4 local_9c8;
  undefined4 local_9c4;
  undefined4 local_9c0;
  undefined4 local_9bc;
  undefined4 local_9b8;
  undefined4 local_9b4;
  uint local_9b0;
  uint local_9ac;
  uint local_9a8;
  RTCFilterFunctionNArguments local_998;
  undefined1 local_968 [16];
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 *local_858;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8 != 8) {
    fVar3 = ray->tfar;
    if (0.0 <= fVar3) {
      local_a60 = context;
      puVar21 = local_7d0;
      auVar39 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar5 = (ray->dir).field_0;
      auVar28._8_4_ = 0x7fffffff;
      auVar28._0_8_ = 0x7fffffff7fffffff;
      auVar28._12_4_ = 0x7fffffff;
      auVar28 = vandps_avx((undefined1  [16])aVar5,auVar28);
      auVar80._8_4_ = 0x219392ef;
      auVar80._0_8_ = 0x219392ef219392ef;
      auVar80._12_4_ = 0x219392ef;
      auVar28 = vcmpps_avx(auVar28,auVar80,1);
      auVar98._8_4_ = 0x3f800000;
      auVar98._0_8_ = 0x3f8000003f800000;
      auVar98._12_4_ = 0x3f800000;
      auVar80 = vdivps_avx(auVar98,(undefined1  [16])aVar5);
      auVar99._8_4_ = 0x5d5e0b6b;
      auVar99._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar99._12_4_ = 0x5d5e0b6b;
      auVar28 = vblendvps_avx(auVar80,auVar99,auVar28);
      auVar86._0_4_ = auVar28._0_4_ * 0.99999964;
      auVar86._4_4_ = auVar28._4_4_ * 0.99999964;
      auVar86._8_4_ = auVar28._8_4_ * 0.99999964;
      auVar86._12_4_ = auVar28._12_4_ * 0.99999964;
      auVar66._0_4_ = auVar28._0_4_ * 1.0000004;
      auVar66._4_4_ = auVar28._4_4_ * 1.0000004;
      auVar66._8_4_ = auVar28._8_4_ * 1.0000004;
      auVar66._12_4_ = auVar28._12_4_ * 1.0000004;
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      auVar114 = ZEXT1664(CONCAT412(uVar4,CONCAT48(uVar4,CONCAT44(uVar4,uVar4))));
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      auVar122 = ZEXT1664(CONCAT412(uVar4,CONCAT48(uVar4,CONCAT44(uVar4,uVar4))));
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar129 = ZEXT1664(CONCAT412(uVar4,CONCAT48(uVar4,CONCAT44(uVar4,uVar4))));
      auVar28 = vshufps_avx(auVar86,auVar86,0);
      auVar131 = ZEXT1664(auVar28);
      auVar28 = vmovshdup_avx(auVar86);
      auVar80 = vshufps_avx(auVar86,auVar86,0x55);
      auVar134 = ZEXT1664(auVar80);
      auVar80 = vshufpd_avx(auVar86,auVar86,1);
      auVar98 = vshufps_avx(auVar86,auVar86,0xaa);
      auVar140 = ZEXT1664(auVar98);
      auVar98 = vshufps_avx(auVar66,auVar66,0);
      auVar146 = ZEXT1664(auVar98);
      uVar22 = (ulong)(auVar86._0_4_ < 0.0) << 4;
      auVar98 = vshufps_avx(auVar66,auVar66,0x55);
      auVar104 = ZEXT1664(auVar98);
      auVar98 = vshufps_avx(auVar66,auVar66,0xaa);
      auVar153 = ZEXT1664(auVar98);
      uVar24 = (ulong)(auVar28._0_4_ < 0.0) << 4 | 0x20;
      uVar20 = (ulong)(auVar80._0_4_ < 0.0) << 4 | 0x40;
      uVar25 = uVar22 ^ 0x10;
      auVar28 = vshufps_avx(auVar39,auVar39,0);
      auVar108 = ZEXT1664(auVar28);
      auVar28 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
      auVar158 = ZEXT1664(auVar28);
      local_968 = mm_lookupmask_ps._240_16_;
      do {
        uVar26 = puVar21[-1];
        puVar21 = puVar21 + -1;
        while( true ) {
          local_8b8 = auVar114._0_16_;
          local_8c8 = auVar122._0_16_;
          local_8d8 = auVar129._0_16_;
          if ((uVar26 & 8) != 0) break;
          uVar15 = uVar26 & 0xfffffffffffffff0;
          fVar3 = (ray->dir).field_0.m128[3];
          auVar27._4_4_ = fVar3;
          auVar27._0_4_ = fVar3;
          auVar27._8_4_ = fVar3;
          auVar27._12_4_ = fVar3;
          pfVar2 = (float *)(uVar15 + 0x80 + uVar22);
          pfVar1 = (float *)(uVar15 + 0x20 + uVar22);
          auVar37._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar37._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar37._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar37._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar28 = vsubps_avx(auVar37,local_8b8);
          auVar38._0_4_ = auVar131._0_4_ * auVar28._0_4_;
          auVar38._4_4_ = auVar131._4_4_ * auVar28._4_4_;
          auVar38._8_4_ = auVar131._8_4_ * auVar28._8_4_;
          auVar38._12_4_ = auVar131._12_4_ * auVar28._12_4_;
          pfVar2 = (float *)(uVar15 + 0x80 + uVar24);
          auVar28 = vmaxps_avx(auVar108._0_16_,auVar38);
          pfVar1 = (float *)(uVar15 + 0x20 + uVar24);
          auVar49._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar49._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar49._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar49._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar80 = vsubps_avx(auVar49,local_8c8);
          pfVar2 = (float *)(uVar15 + 0x80 + uVar20);
          pfVar1 = (float *)(uVar15 + 0x20 + uVar20);
          auVar67._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar67._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar67._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar67._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar50._0_4_ = auVar134._0_4_ * auVar80._0_4_;
          auVar50._4_4_ = auVar134._4_4_ * auVar80._4_4_;
          auVar50._8_4_ = auVar134._8_4_ * auVar80._8_4_;
          auVar50._12_4_ = auVar134._12_4_ * auVar80._12_4_;
          auVar80 = vsubps_avx(auVar67,local_8d8);
          auVar68._0_4_ = auVar140._0_4_ * auVar80._0_4_;
          auVar68._4_4_ = auVar140._4_4_ * auVar80._4_4_;
          auVar68._8_4_ = auVar140._8_4_ * auVar80._8_4_;
          auVar68._12_4_ = auVar140._12_4_ * auVar80._12_4_;
          auVar80 = vmaxps_avx(auVar50,auVar68);
          pfVar2 = (float *)(uVar15 + 0x80 + uVar25);
          pfVar1 = (float *)(uVar15 + 0x20 + uVar25);
          auVar69._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar69._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar69._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar69._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar28 = vmaxps_avx(auVar28,auVar80);
          auVar80 = vsubps_avx(auVar69,local_8b8);
          auVar51._0_4_ = auVar146._0_4_ * auVar80._0_4_;
          auVar51._4_4_ = auVar146._4_4_ * auVar80._4_4_;
          auVar51._8_4_ = auVar146._8_4_ * auVar80._8_4_;
          auVar51._12_4_ = auVar146._12_4_ * auVar80._12_4_;
          auVar80 = vminps_avx(auVar158._0_16_,auVar51);
          pfVar2 = (float *)(uVar15 + 0x80 + (uVar24 ^ 0x10));
          pfVar1 = (float *)(uVar15 + 0x20 + (uVar24 ^ 0x10));
          auVar70._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar70._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar70._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar70._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar39 = vsubps_avx(auVar70,local_8c8);
          auVar71._0_4_ = auVar104._0_4_ * auVar39._0_4_;
          auVar71._4_4_ = auVar104._4_4_ * auVar39._4_4_;
          auVar71._8_4_ = auVar104._8_4_ * auVar39._8_4_;
          auVar71._12_4_ = auVar104._12_4_ * auVar39._12_4_;
          pfVar2 = (float *)(uVar15 + 0x80 + (uVar20 ^ 0x10));
          pfVar1 = (float *)(uVar15 + 0x20 + (uVar20 ^ 0x10));
          auVar87._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar87._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar87._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar87._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar39 = vsubps_avx(auVar87,local_8d8);
          auVar88._0_4_ = auVar153._0_4_ * auVar39._0_4_;
          auVar88._4_4_ = auVar153._4_4_ * auVar39._4_4_;
          auVar88._8_4_ = auVar153._8_4_ * auVar39._8_4_;
          auVar88._12_4_ = auVar153._12_4_ * auVar39._12_4_;
          auVar39 = vminps_avx(auVar71,auVar88);
          auVar80 = vminps_avx(auVar80,auVar39);
          if (((uint)uVar26 & 7) == 6) {
            auVar80 = vcmpps_avx(auVar28,auVar80,2);
            auVar28 = vcmpps_avx(*(undefined1 (*) [16])(uVar15 + 0xe0),auVar27,2);
            auVar39 = vcmpps_avx(auVar27,*(undefined1 (*) [16])(uVar15 + 0xf0),1);
            auVar28 = vandps_avx(auVar28,auVar39);
            auVar28 = vandps_avx(auVar28,auVar80);
          }
          else {
            auVar28 = vcmpps_avx(auVar28,auVar80,2);
          }
          auVar28 = vpslld_avx(auVar28,0x1f);
          uVar16 = vmovmskps_avx(auVar28);
          if (uVar16 == 0) goto LAB_002c2263;
          uVar16 = uVar16 & 0xff;
          lVar19 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
            }
          }
          uVar26 = *(ulong *)(uVar15 + lVar19 * 8);
          uVar16 = uVar16 - 1 & uVar16;
          if (uVar16 != 0) {
            *puVar21 = uVar26;
            puVar21 = puVar21 + 1;
            lVar19 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
              }
            }
            uVar26 = *(ulong *)(uVar15 + lVar19 * 8);
            uVar16 = uVar16 - 1 & uVar16;
            uVar17 = (ulong)uVar16;
            if (uVar16 != 0) {
              do {
                *puVar21 = uVar26;
                puVar21 = puVar21 + 1;
                lVar19 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                  }
                }
                uVar26 = *(ulong *)(uVar15 + lVar19 * 8);
                uVar17 = uVar17 & uVar17 - 1;
              } while (uVar17 != 0);
            }
          }
        }
        lVar19 = (ulong)((uint)uVar26 & 0xf) - 8;
        if (lVar19 != 0) {
          uVar26 = uVar26 & 0xfffffffffffffff0;
          local_9d0 = 0;
          local_8e8 = auVar131._0_16_;
          local_8f8 = auVar134._0_16_;
          local_908 = auVar140._0_16_;
          local_918 = auVar146._0_16_;
          local_928 = auVar104._0_16_;
          local_938 = auVar153._0_16_;
          local_948 = auVar108._0_16_;
          local_958 = auVar158._0_16_;
          do {
            lVar18 = local_9d0 * 0x140;
            fVar3 = (ray->dir).field_0.m128[3];
            pfVar2 = (float *)(uVar26 + 0x90 + lVar18);
            pfVar1 = (float *)(uVar26 + lVar18);
            auVar39._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar39._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar39._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar39._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar26 + 0xa0 + lVar18);
            pfVar1 = (float *)(uVar26 + 0x10 + lVar18);
            auVar52._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar52._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar52._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar52._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar26 + 0xb0 + lVar18);
            pfVar1 = (float *)(uVar26 + 0x20 + lVar18);
            auVar133._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar133._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar133._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar133._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar26 + 0xc0 + lVar18);
            pfVar1 = (float *)(uVar26 + 0x30 + lVar18);
            auVar89._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar89._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar89._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar89._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar26 + 0xd0 + lVar18);
            pfVar1 = (float *)(uVar26 + 0x40 + lVar18);
            auVar100._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar100._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar100._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar100._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar26 + 0xe0 + lVar18);
            pfVar1 = (float *)(uVar26 + 0x50 + lVar18);
            auVar139._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar139._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar139._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar139._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar26 + 0xf0 + lVar18);
            pfVar1 = (float *)(uVar26 + 0x60 + lVar18);
            auVar117._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar117._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar117._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar117._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar26 + 0x100 + lVar18);
            pfVar1 = (float *)(uVar26 + 0x70 + lVar18);
            auVar126._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar126._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar126._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar126._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            pfVar1 = (float *)(uVar26 + 0x110 + lVar18);
            pfVar2 = (float *)(uVar26 + 0x80 + lVar18);
            auVar29._0_4_ = fVar3 * *pfVar1 + *pfVar2;
            auVar29._4_4_ = fVar3 * pfVar1[1] + pfVar2[1];
            auVar29._8_4_ = fVar3 * pfVar1[2] + pfVar2[2];
            auVar29._12_4_ = fVar3 * pfVar1[3] + pfVar2[3];
            uVar4 = *(undefined4 *)&(ray->org).field_0;
            auVar130._4_4_ = uVar4;
            auVar130._0_4_ = uVar4;
            auVar130._8_4_ = uVar4;
            auVar130._12_4_ = uVar4;
            uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar145._4_4_ = uVar4;
            auVar145._0_4_ = uVar4;
            auVar145._8_4_ = uVar4;
            auVar145._12_4_ = uVar4;
            uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar151._4_4_ = uVar4;
            auVar151._0_4_ = uVar4;
            auVar151._8_4_ = uVar4;
            auVar151._12_4_ = uVar4;
            local_9e8 = vsubps_avx(auVar39,auVar130);
            local_a48 = vsubps_avx(auVar52,auVar145);
            local_a58 = vsubps_avx(auVar133,auVar151);
            auVar28 = vsubps_avx(auVar89,auVar130);
            auVar80 = vsubps_avx(auVar100,auVar145);
            auVar39 = vsubps_avx(auVar139,auVar151);
            auVar98 = vsubps_avx(auVar117,auVar130);
            auVar66 = vsubps_avx(auVar126,auVar145);
            auVar86 = vsubps_avx(auVar29,auVar151);
            local_9f8 = vsubps_avx(auVar98,local_9e8);
            local_a08 = vsubps_avx(auVar66,local_a48);
            local_a18 = vsubps_avx(auVar86,local_a58);
            fVar3 = local_a48._0_4_;
            fVar47 = auVar66._0_4_ + fVar3;
            fVar9 = local_a48._4_4_;
            fVar58 = auVar66._4_4_ + fVar9;
            fVar64 = local_a48._8_4_;
            fVar60 = auVar66._8_4_ + fVar64;
            fVar12 = local_a48._12_4_;
            fVar63 = auVar66._12_4_ + fVar12;
            fVar7 = local_a58._0_4_;
            fVar84 = auVar86._0_4_ + fVar7;
            fVar59 = local_a58._4_4_;
            fVar92 = auVar86._4_4_ + fVar59;
            fVar10 = local_a58._8_4_;
            fVar94 = auVar86._8_4_ + fVar10;
            fVar13 = local_a58._12_4_;
            fVar96 = auVar86._12_4_ + fVar13;
            fVar48 = local_a18._0_4_;
            auVar118._0_4_ = fVar48 * fVar47;
            fVar61 = local_a18._4_4_;
            auVar118._4_4_ = fVar61 * fVar58;
            fVar35 = local_a18._8_4_;
            auVar118._8_4_ = fVar35 * fVar60;
            fVar36 = local_a18._12_4_;
            auVar118._12_4_ = fVar36 * fVar63;
            fVar157 = local_a08._0_4_;
            auVar127._0_4_ = fVar157 * fVar84;
            fVar159 = local_a08._4_4_;
            auVar127._4_4_ = fVar159 * fVar92;
            fVar160 = local_a08._8_4_;
            auVar127._8_4_ = fVar160 * fVar94;
            fVar161 = local_a08._12_4_;
            auVar127._12_4_ = fVar161 * fVar96;
            auVar99 = vsubps_avx(auVar127,auVar118);
            fVar8 = local_9e8._0_4_;
            fVar115 = auVar98._0_4_ + fVar8;
            fVar62 = local_9e8._4_4_;
            fVar123 = auVar98._4_4_ + fVar62;
            fVar11 = local_9e8._8_4_;
            fVar124 = auVar98._8_4_ + fVar11;
            fVar14 = local_9e8._12_4_;
            fVar125 = auVar98._12_4_ + fVar14;
            fVar150 = local_9f8._0_4_;
            auVar90._0_4_ = fVar150 * fVar84;
            fVar154 = local_9f8._4_4_;
            auVar90._4_4_ = fVar154 * fVar92;
            fVar155 = local_9f8._8_4_;
            auVar90._8_4_ = fVar155 * fVar94;
            fVar156 = local_9f8._12_4_;
            auVar90._12_4_ = fVar156 * fVar96;
            auVar128._0_4_ = fVar115 * fVar48;
            auVar128._4_4_ = fVar123 * fVar61;
            auVar128._8_4_ = fVar124 * fVar35;
            auVar128._12_4_ = fVar125 * fVar36;
            auVar29 = vsubps_avx(auVar128,auVar90);
            auVar119._0_4_ = fVar157 * fVar115;
            auVar119._4_4_ = fVar159 * fVar123;
            auVar119._8_4_ = fVar160 * fVar124;
            auVar119._12_4_ = fVar161 * fVar125;
            auVar30._0_4_ = fVar150 * fVar47;
            auVar30._4_4_ = fVar154 * fVar58;
            auVar30._8_4_ = fVar155 * fVar60;
            auVar30._12_4_ = fVar156 * fVar63;
            auVar30 = vsubps_avx(auVar30,auVar119);
            local_a78._4_4_ = (ray->dir).field_0.m128[2];
            local_aa8._4_4_ = (ray->dir).field_0.m128[1];
            local_a88._4_4_ = (ray->dir).field_0.m128[0];
            local_a38._0_4_ =
                 auVar99._0_4_ * local_a88._4_4_ +
                 local_aa8._4_4_ * auVar29._0_4_ + local_a78._4_4_ * auVar30._0_4_;
            local_a38._4_4_ =
                 auVar99._4_4_ * local_a88._4_4_ +
                 local_aa8._4_4_ * auVar29._4_4_ + local_a78._4_4_ * auVar30._4_4_;
            local_a38._8_4_ =
                 auVar99._8_4_ * local_a88._4_4_ +
                 local_aa8._4_4_ * auVar29._8_4_ + local_a78._4_4_ * auVar30._8_4_;
            local_a38._12_4_ =
                 auVar99._12_4_ * local_a88._4_4_ +
                 local_aa8._4_4_ * auVar29._12_4_ + local_a78._4_4_ * auVar30._12_4_;
            local_a28 = vsubps_avx(local_a48,auVar80);
            auVar99 = vsubps_avx(local_a58,auVar39);
            fVar47 = fVar3 + auVar80._0_4_;
            fVar58 = fVar9 + auVar80._4_4_;
            fVar60 = fVar64 + auVar80._8_4_;
            fVar63 = fVar12 + auVar80._12_4_;
            fVar92 = auVar39._0_4_ + fVar7;
            fVar96 = auVar39._4_4_ + fVar59;
            fVar123 = auVar39._8_4_ + fVar10;
            fVar125 = auVar39._12_4_ + fVar13;
            fVar144 = auVar99._0_4_;
            auVar152._0_4_ = fVar144 * fVar47;
            fVar147 = auVar99._4_4_;
            auVar152._4_4_ = fVar147 * fVar58;
            fVar148 = auVar99._8_4_;
            auVar152._8_4_ = fVar148 * fVar60;
            fVar149 = auVar99._12_4_;
            auVar152._12_4_ = fVar149 * fVar63;
            fVar84 = local_a28._0_4_;
            auVar72._0_4_ = fVar84 * fVar92;
            fVar94 = local_a28._4_4_;
            auVar72._4_4_ = fVar94 * fVar96;
            fVar115 = local_a28._8_4_;
            auVar72._8_4_ = fVar115 * fVar123;
            fVar124 = local_a28._12_4_;
            auVar72._12_4_ = fVar124 * fVar125;
            auVar99 = vsubps_avx(auVar72,auVar152);
            auVar29 = vsubps_avx(local_9e8,auVar28);
            fVar132 = auVar29._0_4_;
            auVar91._0_4_ = fVar132 * fVar92;
            fVar135 = auVar29._4_4_;
            auVar91._4_4_ = fVar135 * fVar96;
            fVar136 = auVar29._8_4_;
            auVar91._8_4_ = fVar136 * fVar123;
            fVar137 = auVar29._12_4_;
            auVar91._12_4_ = fVar137 * fVar125;
            fVar92 = auVar28._0_4_ + fVar8;
            fVar96 = auVar28._4_4_ + fVar62;
            fVar123 = auVar28._8_4_ + fVar11;
            fVar125 = auVar28._12_4_ + fVar14;
            auVar120._0_4_ = fVar144 * fVar92;
            auVar120._4_4_ = fVar147 * fVar96;
            auVar120._8_4_ = fVar148 * fVar123;
            auVar120._12_4_ = fVar149 * fVar125;
            auVar29 = vsubps_avx(auVar120,auVar91);
            auVar109._0_4_ = fVar84 * fVar92;
            auVar109._4_4_ = fVar94 * fVar96;
            auVar109._8_4_ = fVar115 * fVar123;
            auVar109._12_4_ = fVar124 * fVar125;
            auVar31._0_4_ = fVar132 * fVar47;
            auVar31._4_4_ = fVar135 * fVar58;
            auVar31._8_4_ = fVar136 * fVar60;
            auVar31._12_4_ = fVar137 * fVar63;
            auVar30 = vsubps_avx(auVar31,auVar109);
            local_898._0_4_ =
                 local_a88._4_4_ * auVar99._0_4_ +
                 local_aa8._4_4_ * auVar29._0_4_ + local_a78._4_4_ * auVar30._0_4_;
            local_898._4_4_ =
                 local_a88._4_4_ * auVar99._4_4_ +
                 local_aa8._4_4_ * auVar29._4_4_ + local_a78._4_4_ * auVar30._4_4_;
            local_898._8_4_ =
                 local_a88._4_4_ * auVar99._8_4_ +
                 local_aa8._4_4_ * auVar29._8_4_ + local_a78._4_4_ * auVar30._8_4_;
            local_898._12_4_ =
                 local_a88._4_4_ * auVar99._12_4_ +
                 local_aa8._4_4_ * auVar29._12_4_ + local_a78._4_4_ * auVar30._12_4_;
            auVar99 = vsubps_avx(auVar28,auVar98);
            fVar65 = auVar28._0_4_ + auVar98._0_4_;
            fVar81 = auVar28._4_4_ + auVar98._4_4_;
            fVar82 = auVar28._8_4_ + auVar98._8_4_;
            fVar83 = auVar28._12_4_ + auVar98._12_4_;
            auVar28 = vsubps_avx(auVar80,auVar66);
            fVar92 = auVar80._0_4_ + auVar66._0_4_;
            fVar96 = auVar80._4_4_ + auVar66._4_4_;
            fVar123 = auVar80._8_4_ + auVar66._8_4_;
            fVar125 = auVar80._12_4_ + auVar66._12_4_;
            auVar80 = vsubps_avx(auVar39,auVar86);
            fVar47 = auVar39._0_4_ + auVar86._0_4_;
            fVar58 = auVar39._4_4_ + auVar86._4_4_;
            fVar60 = auVar39._8_4_ + auVar86._8_4_;
            fVar63 = auVar39._12_4_ + auVar86._12_4_;
            fVar85 = auVar80._0_4_;
            auVar101._0_4_ = fVar85 * fVar92;
            fVar93 = auVar80._4_4_;
            auVar101._4_4_ = fVar93 * fVar96;
            fVar95 = auVar80._8_4_;
            auVar101._8_4_ = fVar95 * fVar123;
            fVar97 = auVar80._12_4_;
            auVar101._12_4_ = fVar97 * fVar125;
            fVar138 = auVar28._0_4_;
            auVar110._0_4_ = fVar138 * fVar47;
            fVar141 = auVar28._4_4_;
            auVar110._4_4_ = fVar141 * fVar58;
            fVar142 = auVar28._8_4_;
            auVar110._8_4_ = fVar142 * fVar60;
            fVar143 = auVar28._12_4_;
            auVar110._12_4_ = fVar143 * fVar63;
            auVar28 = vsubps_avx(auVar110,auVar101);
            fVar116 = auVar99._0_4_;
            auVar40._0_4_ = fVar116 * fVar47;
            fVar47 = auVar99._4_4_;
            auVar40._4_4_ = fVar47 * fVar58;
            fVar58 = auVar99._8_4_;
            auVar40._8_4_ = fVar58 * fVar60;
            fVar60 = auVar99._12_4_;
            auVar40._12_4_ = fVar60 * fVar63;
            auVar111._0_4_ = fVar85 * fVar65;
            auVar111._4_4_ = fVar93 * fVar81;
            auVar111._8_4_ = fVar95 * fVar82;
            auVar111._12_4_ = fVar97 * fVar83;
            auVar80 = vsubps_avx(auVar111,auVar40);
            auVar73._0_4_ = fVar138 * fVar65;
            auVar73._4_4_ = fVar141 * fVar81;
            auVar73._8_4_ = fVar142 * fVar82;
            auVar73._12_4_ = fVar143 * fVar83;
            auVar53._0_4_ = fVar116 * fVar92;
            auVar53._4_4_ = fVar47 * fVar96;
            auVar53._8_4_ = fVar58 * fVar123;
            auVar53._12_4_ = fVar60 * fVar125;
            auVar39 = vsubps_avx(auVar53,auVar73);
            local_a78._0_4_ = local_a78._4_4_;
            fStack_a70 = local_a78._4_4_;
            fStack_a6c = local_a78._4_4_;
            local_aa8._0_4_ = local_aa8._4_4_;
            fStack_aa0 = local_aa8._4_4_;
            fStack_a9c = local_aa8._4_4_;
            local_a88._0_4_ = local_a88._4_4_;
            fStack_a80 = local_a88._4_4_;
            fStack_a7c = local_a88._4_4_;
            auVar41._0_4_ =
                 local_a88._4_4_ * auVar28._0_4_ +
                 local_aa8._4_4_ * auVar80._0_4_ + local_a78._4_4_ * auVar39._0_4_;
            auVar41._4_4_ =
                 local_a88._4_4_ * auVar28._4_4_ +
                 local_aa8._4_4_ * auVar80._4_4_ + local_a78._4_4_ * auVar39._4_4_;
            auVar41._8_4_ =
                 local_a88._4_4_ * auVar28._8_4_ +
                 local_aa8._4_4_ * auVar80._8_4_ + local_a78._4_4_ * auVar39._8_4_;
            auVar41._12_4_ =
                 local_a88._4_4_ * auVar28._12_4_ +
                 local_aa8._4_4_ * auVar80._12_4_ + local_a78._4_4_ * auVar39._12_4_;
            local_868._0_4_ = auVar41._0_4_ + local_a38._0_4_ + local_898._0_4_;
            local_868._4_4_ = auVar41._4_4_ + local_a38._4_4_ + local_898._4_4_;
            local_868._8_4_ = auVar41._8_4_ + local_a38._8_4_ + local_898._8_4_;
            local_868._12_4_ = auVar41._12_4_ + local_a38._12_4_ + local_898._12_4_;
            auVar28 = vminps_avx(local_a38,local_898);
            auVar28 = vminps_avx(auVar28,auVar41);
            auVar74._8_4_ = 0x7fffffff;
            auVar74._0_8_ = 0x7fffffff7fffffff;
            auVar74._12_4_ = 0x7fffffff;
            local_8a8 = vandps_avx(local_868,auVar74);
            auVar75._0_4_ = local_8a8._0_4_ * 1.1920929e-07;
            auVar75._4_4_ = local_8a8._4_4_ * 1.1920929e-07;
            auVar75._8_4_ = local_8a8._8_4_ * 1.1920929e-07;
            auVar75._12_4_ = local_8a8._12_4_ * 1.1920929e-07;
            uVar15 = CONCAT44(auVar75._4_4_,auVar75._0_4_);
            auVar102._0_8_ = uVar15 ^ 0x8000000080000000;
            auVar102._8_4_ = -auVar75._8_4_;
            auVar102._12_4_ = -auVar75._12_4_;
            auVar28 = vcmpps_avx(auVar28,auVar102,5);
            auVar80 = vmaxps_avx(local_a38,local_898);
            auVar80 = vmaxps_avx(auVar80,auVar41);
            auVar80 = vcmpps_avx(auVar80,auVar75,2);
            auVar28 = vorps_avx(auVar28,auVar80);
            auVar80 = local_968 & auVar28;
            if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar80 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar80 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar80[0xf] < '\0') {
              auVar42._0_4_ = fVar84 * fVar48;
              auVar42._4_4_ = fVar94 * fVar61;
              auVar42._8_4_ = fVar115 * fVar35;
              auVar42._12_4_ = fVar124 * fVar36;
              auVar54._0_4_ = fVar157 * fVar144;
              auVar54._4_4_ = fVar159 * fVar147;
              auVar54._8_4_ = fVar160 * fVar148;
              auVar54._12_4_ = fVar161 * fVar149;
              auVar98 = vsubps_avx(auVar54,auVar42);
              auVar76._0_4_ = fVar144 * fVar138;
              auVar76._4_4_ = fVar147 * fVar141;
              auVar76._8_4_ = fVar148 * fVar142;
              auVar76._12_4_ = fVar149 * fVar143;
              auVar103._0_4_ = fVar84 * fVar85;
              auVar103._4_4_ = fVar94 * fVar93;
              auVar103._8_4_ = fVar115 * fVar95;
              auVar103._12_4_ = fVar124 * fVar97;
              auVar66 = vsubps_avx(auVar103,auVar76);
              auVar80 = vandps_avx(auVar74,auVar42);
              auVar39 = vandps_avx(auVar74,auVar76);
              auVar80 = vcmpps_avx(auVar80,auVar39,1);
              local_808 = vblendvps_avx(auVar66,auVar98,auVar80);
              auVar43._0_4_ = fVar132 * fVar85;
              auVar43._4_4_ = fVar135 * fVar93;
              auVar43._8_4_ = fVar136 * fVar95;
              auVar43._12_4_ = fVar137 * fVar97;
              auVar55._0_4_ = fVar132 * fVar48;
              auVar55._4_4_ = fVar135 * fVar61;
              auVar55._8_4_ = fVar136 * fVar35;
              auVar55._12_4_ = fVar137 * fVar36;
              auVar77._0_4_ = fVar144 * fVar150;
              auVar77._4_4_ = fVar147 * fVar154;
              auVar77._8_4_ = fVar148 * fVar155;
              auVar77._12_4_ = fVar149 * fVar156;
              auVar98 = vsubps_avx(auVar55,auVar77);
              auVar105._0_4_ = fVar144 * fVar116;
              auVar105._4_4_ = fVar147 * fVar47;
              auVar105._8_4_ = fVar148 * fVar58;
              auVar105._12_4_ = fVar149 * fVar60;
              auVar66 = vsubps_avx(auVar105,auVar43);
              auVar80 = vandps_avx(auVar74,auVar77);
              auVar39 = vandps_avx(auVar74,auVar43);
              auVar80 = vcmpps_avx(auVar80,auVar39,1);
              local_7f8 = vblendvps_avx(auVar66,auVar98,auVar80);
              auVar32._0_4_ = fVar84 * fVar116;
              auVar32._4_4_ = fVar94 * fVar47;
              auVar32._8_4_ = fVar115 * fVar58;
              auVar32._12_4_ = fVar124 * fVar60;
              auVar56._0_4_ = fVar84 * fVar150;
              auVar56._4_4_ = fVar94 * fVar154;
              auVar56._8_4_ = fVar115 * fVar155;
              auVar56._12_4_ = fVar124 * fVar156;
              auVar78._0_4_ = fVar157 * fVar132;
              auVar78._4_4_ = fVar159 * fVar135;
              auVar78._8_4_ = fVar160 * fVar136;
              auVar78._12_4_ = fVar161 * fVar137;
              auVar106._0_4_ = fVar132 * fVar138;
              auVar106._4_4_ = fVar135 * fVar141;
              auVar106._8_4_ = fVar136 * fVar142;
              auVar106._12_4_ = fVar137 * fVar143;
              auVar98 = vsubps_avx(auVar56,auVar78);
              auVar66 = vsubps_avx(auVar106,auVar32);
              auVar80 = vandps_avx(auVar74,auVar78);
              auVar39 = vandps_avx(auVar74,auVar32);
              auVar80 = vcmpps_avx(auVar80,auVar39,1);
              local_7e8 = vblendvps_avx(auVar66,auVar98,auVar80);
              fVar48 = local_808._0_4_ * local_a88._4_4_ +
                       local_7f8._0_4_ * local_aa8._4_4_ + local_7e8._0_4_ * local_a78._4_4_;
              fVar47 = local_808._4_4_ * local_a88._4_4_ +
                       local_7f8._4_4_ * local_aa8._4_4_ + local_7e8._4_4_ * local_a78._4_4_;
              fVar61 = local_808._8_4_ * local_a88._4_4_ +
                       local_7f8._8_4_ * local_aa8._4_4_ + local_7e8._8_4_ * local_a78._4_4_;
              fVar58 = local_808._12_4_ * local_a88._4_4_ +
                       local_7f8._12_4_ * local_aa8._4_4_ + local_7e8._12_4_ * local_a78._4_4_;
              auVar79._0_4_ = fVar48 + fVar48;
              auVar79._4_4_ = fVar47 + fVar47;
              auVar79._8_4_ = fVar61 + fVar61;
              auVar79._12_4_ = fVar58 + fVar58;
              fVar48 = local_808._0_4_ * fVar8 + local_7f8._0_4_ * fVar3 + local_7e8._0_4_ * fVar7;
              fVar59 = local_808._4_4_ * fVar62 + local_7f8._4_4_ * fVar9 + local_7e8._4_4_ * fVar59
              ;
              fVar62 = local_808._8_4_ * fVar11 +
                       local_7f8._8_4_ * fVar64 + local_7e8._8_4_ * fVar10;
              fVar64 = local_808._12_4_ * fVar14 +
                       local_7f8._12_4_ * fVar12 + local_7e8._12_4_ * fVar13;
              auVar80 = vrcpps_avx(auVar79);
              fVar3 = auVar80._0_4_;
              auVar112._0_4_ = auVar79._0_4_ * fVar3;
              fVar7 = auVar80._4_4_;
              auVar112._4_4_ = auVar79._4_4_ * fVar7;
              fVar8 = auVar80._8_4_;
              auVar112._8_4_ = auVar79._8_4_ * fVar8;
              fVar9 = auVar80._12_4_;
              auVar112._12_4_ = auVar79._12_4_ * fVar9;
              auVar121._8_4_ = 0x3f800000;
              auVar121._0_8_ = 0x3f8000003f800000;
              auVar121._12_4_ = 0x3f800000;
              auVar80 = vsubps_avx(auVar121,auVar112);
              local_818._0_4_ = (fVar48 + fVar48) * (fVar3 + fVar3 * auVar80._0_4_);
              local_818._4_4_ = (fVar59 + fVar59) * (fVar7 + fVar7 * auVar80._4_4_);
              local_818._8_4_ = (fVar62 + fVar62) * (fVar8 + fVar8 * auVar80._8_4_);
              local_818._12_4_ = (fVar64 + fVar64) * (fVar9 + fVar9 * auVar80._12_4_);
              uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
              auVar107._4_4_ = uVar4;
              auVar107._0_4_ = uVar4;
              auVar107._8_4_ = uVar4;
              auVar107._12_4_ = uVar4;
              auVar80 = vcmpps_avx(auVar107,local_818,2);
              fVar3 = ray->tfar;
              auVar113._4_4_ = fVar3;
              auVar113._0_4_ = fVar3;
              auVar113._8_4_ = fVar3;
              auVar113._12_4_ = fVar3;
              auVar39 = vcmpps_avx(local_818,auVar113,2);
              auVar80 = vandps_avx(auVar80,auVar39);
              auVar39 = vcmpps_avx(auVar79,_DAT_01f7aa10,4);
              auVar80 = vandps_avx(auVar39,auVar80);
              auVar28 = vandps_avx(auVar28,local_968);
              auVar80 = vpslld_avx(auVar80,0x1f);
              auVar80 = vpsrad_avx(auVar80,0x1f);
              local_848 = vpand_avx(auVar80,auVar28);
              uVar16 = vmovmskps_avx(local_848);
              if (uVar16 != 0) {
                local_aa8 = lVar18 + uVar26;
                local_888 = local_a38;
                local_878 = local_898;
                local_858 = &local_aa9;
                auVar28 = vrcpps_avx(local_868);
                fVar3 = auVar28._0_4_;
                auVar44._0_4_ = local_868._0_4_ * fVar3;
                fVar7 = auVar28._4_4_;
                auVar44._4_4_ = local_868._4_4_ * fVar7;
                fVar8 = auVar28._8_4_;
                auVar44._8_4_ = local_868._8_4_ * fVar8;
                fVar9 = auVar28._12_4_;
                auVar44._12_4_ = local_868._12_4_ * fVar9;
                auVar57._8_4_ = 0x3f800000;
                auVar57._0_8_ = 0x3f8000003f800000;
                auVar57._12_4_ = 0x3f800000;
                auVar28 = vsubps_avx(auVar57,auVar44);
                auVar33._0_4_ = fVar3 + fVar3 * auVar28._0_4_;
                auVar33._4_4_ = fVar7 + fVar7 * auVar28._4_4_;
                auVar33._8_4_ = fVar8 + fVar8 * auVar28._8_4_;
                auVar33._12_4_ = fVar9 + fVar9 * auVar28._12_4_;
                auVar45._8_4_ = 0x219392ef;
                auVar45._0_8_ = 0x219392ef219392ef;
                auVar45._12_4_ = 0x219392ef;
                auVar28 = vcmpps_avx(local_8a8,auVar45,5);
                auVar28 = vandps_avx(auVar28,auVar33);
                auVar46._0_4_ = local_a38._0_4_ * auVar28._0_4_;
                auVar46._4_4_ = local_a38._4_4_ * auVar28._4_4_;
                auVar46._8_4_ = local_a38._8_4_ * auVar28._8_4_;
                auVar46._12_4_ = local_a38._12_4_ * auVar28._12_4_;
                local_838 = vminps_avx(auVar46,auVar57);
                auVar34._0_4_ = local_898._0_4_ * auVar28._0_4_;
                auVar34._4_4_ = local_898._4_4_ * auVar28._4_4_;
                auVar34._8_4_ = local_898._8_4_ * auVar28._8_4_;
                auVar34._12_4_ = local_898._12_4_ * auVar28._12_4_;
                local_828 = vminps_avx(auVar34,auVar57);
                uVar15 = (ulong)(uVar16 & 0xff);
                local_a78 = local_a60->scene;
                lVar18 = lVar18 + uVar26;
                pSVar23 = local_a60->scene;
                do {
                  uVar17 = 0;
                  if (uVar15 != 0) {
                    for (; (uVar15 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                    }
                  }
                  local_9b0 = *(uint *)(lVar18 + 0x120 + uVar17 * 4);
                  pGVar6 = (pSVar23->geometries).items[local_9b0].ptr;
                  if ((pGVar6->mask & ray->mask) == 0) {
                    uVar15 = uVar15 ^ 1L << (uVar17 & 0x3f);
                  }
                  else {
                    local_a88 = uVar17;
                    local_9e8._0_8_ = uVar15;
                    if ((local_a60->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002c2273;
                    local_a48._0_8_ = local_a60->args;
                    local_a18._0_8_ = lVar19;
                    local_a08._0_8_ = uVar22;
                    local_9f8._0_8_ = puVar21;
                    local_998.context = local_a60->user;
                    local_9c8 = *(undefined4 *)(local_808 + uVar17 * 4);
                    local_9c4 = *(undefined4 *)(local_7f8 + uVar17 * 4);
                    local_9c0 = *(undefined4 *)(local_7e8 + uVar17 * 4);
                    local_9bc = *(undefined4 *)(local_838 + uVar17 * 4);
                    local_9b8 = *(undefined4 *)(local_828 + uVar17 * 4);
                    local_9b4 = *(undefined4 *)(local_aa8 + 0x130 + uVar17 * 4);
                    local_9ac = (local_998.context)->instID[0];
                    local_9a8 = (local_998.context)->instPrimID[0];
                    local_a28._0_4_ = ray->tfar;
                    ray->tfar = *(float *)(local_818 + uVar17 * 4);
                    local_a8c = -1;
                    local_998.valid = &local_a8c;
                    local_998.geometryUserPtr = pGVar6->userPtr;
                    local_a58._0_8_ = ray;
                    local_998.hit = (RTCHitN *)&local_9c8;
                    local_998.N = 1;
                    local_a38._0_8_ = pGVar6;
                    local_998.ray = (RTCRayN *)ray;
                    if ((pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar6->occlusionFilterN)(&local_998), *local_998.valid != 0)) {
                      ray = (Ray *)local_a58._0_8_;
                      if ((*(code **)(local_a48._0_8_ + 0x10) == (code *)0x0) ||
                         (((*(byte *)local_a48._0_8_ & 2) == 0 &&
                          ((*(byte *)(local_a38._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_002c2273:
                        ray->tfar = -INFINITY;
                        return;
                      }
                      (**(code **)(local_a48._0_8_ + 0x10))(&local_998);
                      ray = (Ray *)local_a58._0_8_;
                      if (*local_998.valid != 0) goto LAB_002c2273;
                    }
                    *(undefined4 *)(local_a58._0_8_ + 0x20) = local_a28._0_4_;
                    uVar15 = local_9e8._0_8_ ^ 1L << (local_a88 & 0x3f);
                    lVar19 = local_a18._0_8_;
                    ray = (Ray *)local_a58._0_8_;
                    puVar21 = (ulong *)local_9f8._0_8_;
                    uVar22 = local_a08._0_8_;
                  }
                  lVar18 = local_aa8;
                  pSVar23 = local_a78;
                } while (uVar15 != 0);
              }
            }
            local_9d0 = local_9d0 + 1;
            auVar114 = ZEXT1664(local_8b8);
            auVar122 = ZEXT1664(local_8c8);
            auVar129 = ZEXT1664(local_8d8);
            auVar131 = ZEXT1664(local_8e8);
            auVar134 = ZEXT1664(local_8f8);
            auVar140 = ZEXT1664(local_908);
            auVar146 = ZEXT1664(local_918);
            auVar104 = ZEXT1664(local_928);
            auVar153 = ZEXT1664(local_938);
            auVar108 = ZEXT1664(local_948);
            auVar158 = ZEXT1664(local_958);
          } while (local_9d0 != lVar19);
        }
LAB_002c2263:
      } while (puVar21 != &local_7d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }